

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Generic_Door(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4
                   )

{
  bool bVar1;
  uint uVar2;
  int tag;
  
  uVar2 = 0;
  if ((arg2 & 0x3fU) < 4) {
    tag = 0;
    if (-1 < (char)arg2) {
      tag = arg0;
    }
    bVar1 = EV_DoDoor(*(EVlDoor *)(&DAT_0069750c + (ulong)(arg2 & 0x3fU) * 4),ln,it,tag,
                      (double)arg1 * 0.125,(arg3 * 0x23) / 8,arg4,(int)(char)arg2 >> 7 & arg0,
                      SUB41((arg2 & 0x40U) >> 6,0),0);
    uVar2 = (uint)bVar1;
  }
  return uVar2;
}

Assistant:

FUNC(LS_Generic_Door)
// Generic_Door (tag, speed, kind, delay, lock)
{
	int tag, lightTag;
	DDoor::EVlDoor type;
	bool boomgen = false;

	switch (arg2 & 63)
	{
		case 0: type = DDoor::doorRaise;			break;
		case 1: type = DDoor::doorOpen;				break;
		case 2: type = DDoor::doorCloseWaitOpen;	break;
		case 3: type = DDoor::doorClose;			break;
		default: return false;
	}
	// Boom doesn't allow manual generalized doors to be activated while they move
	if (arg2 & 64) boomgen = true;
	if (arg2 & 128)
	{
		// New for 2.0.58: Finally support BOOM's local door light effect
		tag = 0;
		lightTag = arg0;
	}
	else
	{
		tag = arg0;
		lightTag = 0;
	}
	return EV_DoDoor (type, ln, it, tag, SPEED(arg1), OCTICS(arg3), arg4, lightTag, boomgen);
}